

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

void __thiscall
ChainstateManager::UpdateUncommittedBlockStructures
          (ChainstateManager *this,CBlock *block,CBlockIndex *pindexPrev)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CTransaction *in_RDI;
  long in_FS_OFFSET;
  int commitpos;
  CMutableTransaction tx;
  undefined6 in_stack_ffffffffffffff48;
  BuriedDeployment in_stack_ffffffffffffff4e;
  ChainstateManager *in_stack_ffffffffffffff50;
  CMutableTransaction *txIn;
  CBlockIndex *in_stack_ffffffffffffff58;
  vector<CTxIn,_std::allocator<CTxIn>_> *this_00;
  allocator_type *in_stack_ffffffffffffff60;
  size_type __new_size;
  CBlock *in_stack_ffffffffffffff68;
  CMutableTransaction *in_stack_ffffffffffffff78;
  vector<CTxIn,_std::allocator<CTxIn>_> local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffe0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffe8;
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = GetWitnessCommitmentIndex(in_stack_ffffffffffffff68);
  if ((UpdateUncommittedBlockStructures(CBlock&,CBlockIndex_const*)::nonce == '\0') &&
     (iVar3 = __cxa_guard_acquire(&UpdateUncommittedBlockStructures(CBlock&,CBlockIndex_const*)::
                                   nonce), iVar3 != 0)) {
    local_9 = 0;
    in_stack_ffffffffffffff68 = (CBlock *)&stack0xfffffffffffffff6;
    std::allocator<unsigned_char>::allocator
              ((allocator<unsigned_char> *)
               CONCAT26(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff78,
               (size_type)in_RDI,(value_type_conflict3 *)in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff60);
    std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)
               CONCAT26(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48));
    __cxa_atexit(std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector,
                 &UpdateUncommittedBlockStructures::nonce,&__dso_handle);
    __cxa_guard_release(&UpdateUncommittedBlockStructures(CBlock&,CBlockIndex_const*)::nonce);
  }
  if ((iVar2 != -1) &&
     (bVar1 = DeploymentActiveAfter<Consensus::BuriedDeployment>
                        (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                         in_stack_ffffffffffffff4e), bVar1)) {
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_ffffffffffffff58,(size_type)in_stack_ffffffffffffff50);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT26(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48));
    bVar1 = CTransaction::HasWitness
                      ((CTransaction *)CONCAT26(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)
                      );
    if (!bVar1) {
      __new_size = 0;
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)in_stack_ffffffffffffff58,(size_type)in_stack_ffffffffffffff50);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                )in_stack_ffffffffffffff58);
      this_00 = &local_48;
      CMutableTransaction::CMutableTransaction(in_stack_ffffffffffffff78,in_RDI);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                (this_00,(size_type)in_stack_ffffffffffffff50);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::resize((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)in_stack_ffffffffffffff68,__new_size);
      txIn = (CMutableTransaction *)0x0;
      std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[](this_00,0);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)this_00,(size_type)txIn);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
      ::MakeTransactionRef<CMutableTransaction>(txIn);
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)this_00,(size_type)txIn);
      std::shared_ptr<const_CTransaction>::operator=
                ((shared_ptr<const_CTransaction> *)this_00,(shared_ptr<const_CTransaction> *)txIn);
      std::shared_ptr<const_CTransaction>::~shared_ptr
                ((shared_ptr<const_CTransaction> *)
                 CONCAT26(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48));
      CMutableTransaction::~CMutableTransaction
                ((CMutableTransaction *)
                 CONCAT26(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ChainstateManager::UpdateUncommittedBlockStructures(CBlock& block, const CBlockIndex* pindexPrev) const
{
    int commitpos = GetWitnessCommitmentIndex(block);
    static const std::vector<unsigned char> nonce(32, 0x00);
    if (commitpos != NO_WITNESS_COMMITMENT && DeploymentActiveAfter(pindexPrev, *this, Consensus::DEPLOYMENT_SEGWIT) && !block.vtx[0]->HasWitness()) {
        CMutableTransaction tx(*block.vtx[0]);
        tx.vin[0].scriptWitness.stack.resize(1);
        tx.vin[0].scriptWitness.stack[0] = nonce;
        block.vtx[0] = MakeTransactionRef(std::move(tx));
    }
}